

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  undefined4 uVar1;
  int iVar2;
  int line_local;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr op_local;
  FuncState *fs_local;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_DIV:
  case OPR_MOD:
  case OPR_POW:
    codearith(fs,op + OPR_AND,e1,e2,line);
    break;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if ((e2->k == VRELOCABLE) && ((fs->f->code[(e2->u).info] & 0x3f) == 0x16)) {
      freeexp(fs,e1);
      fs->f->code[(e2->u).info] = fs->f->code[(e2->u).info] & 0x7fffff | (e1->u).info << 0x17;
      e1->k = VRELOCABLE;
      (e1->u).ind = (e2->u).ind;
    }
    else {
      luaK_exp2nextreg(fs,e2);
      codearith(fs,OP_CONCAT,e1,e2,line);
    }
    break;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
    codecomp(fs,op + 0x11,1,e1,e2);
    break;
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    codecomp(fs,op + OPR_OR,0,e1,e2);
    break;
  case OPR_AND:
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->f,e1->f);
    uVar1 = *(undefined4 *)&e2->field_0x4;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar1;
    e1->u = e2->u;
    iVar2 = e2->f;
    e1->t = e2->t;
    e1->f = iVar2;
    break;
  case OPR_OR:
    luaK_dischargevars(fs,e2);
    luaK_concat(fs,&e2->t,e1->t);
    uVar1 = *(undefined4 *)&e2->field_0x4;
    e1->k = e2->k;
    *(undefined4 *)&e1->field_0x4 = uVar1;
    e1->u = e2->u;
    iVar2 = e2->f;
    e1->t = e2->t;
    e1->f = iVar2;
  }
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr op,
                  expdesc *e1, expdesc *e2, int line) {
  switch (op) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list must be closed */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list must be closed */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2val(fs, e2);
      if (e2->k == VRELOCABLE && GET_OPCODE(getcode(fs, e2)) == OP_CONCAT) {
        lua_assert(e1->u.info == GETARG_B(getcode(fs, e2))-1);
        freeexp(fs, e1);
        SETARG_B(getcode(fs, e2), e1->u.info);
        e1->k = VRELOCABLE; e1->u.info = e2->u.info;
      }
      else {
        luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
        codearith(fs, OP_CONCAT, e1, e2, line);
      }
      break;
    }
    case OPR_ADD: case OPR_SUB: case OPR_MUL: case OPR_DIV:
    case OPR_MOD: case OPR_POW: {
      codearith(fs, cast(OpCode, op - OPR_ADD + OP_ADD), e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_LT: case OPR_LE: {
      codecomp(fs, cast(OpCode, op - OPR_EQ + OP_EQ), 1, e1, e2);
      break;
    }
    case OPR_NE: case OPR_GT: case OPR_GE: {
      codecomp(fs, cast(OpCode, op - OPR_NE + OP_EQ), 0, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}